

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mediator_unittests.cc
# Opt level: O0

void __thiscall cpp_mediator_send_receive_Test::TestBody(cpp_mediator_send_receive_Test *this)

{
  bool bVar1;
  response_type rVar2;
  char *pcVar3;
  BHandler *pBVar4;
  AssertHelper local_190;
  Message local_188;
  int local_17c;
  undefined1 local_178 [8];
  AssertionResult gtest_ar_4;
  response_type local_15c;
  response_type b_res_2;
  Message local_150;
  int local_144;
  undefined1 local_140 [8];
  AssertionResult gtest_ar_3;
  response_type local_124;
  undefined1 local_120 [4];
  response_type a_res_1;
  mediator<AHandler2_&,_BHandler_&> m_2;
  Message local_100;
  undefined1 local_f4 [12];
  AssertionResult gtest_ar_2;
  response_type local_d4;
  response_type b_res_1;
  Message local_c8;
  undefined1 local_bc [12];
  AssertionResult gtest_ar_1;
  response_type local_9c;
  undefined1 local_98 [4];
  response_type a_res;
  mediator<AHandler1_&,_BHandler_&> m_1;
  AssertHelper local_78;
  Message local_70;
  undefined1 local_64 [12];
  AssertionResult gtest_ar;
  response_type local_48 [2];
  response_type b_res;
  undefined1 local_38 [8];
  mediator<BHandler_&> m;
  BHandler b;
  AHandler2 a2;
  AHandler1 a1;
  cpp_mediator_send_receive_Test *this_local;
  
  a2.super_request_handler<GetA>._vptr_request_handler = (request_handler<GetA>)(_func_int **)0x0;
  AHandler1::AHandler1((AHandler1 *)&a2);
  b.super_request_handler<GetB>._vptr_request_handler = (request_handler<GetB>)(_func_int **)0x0;
  AHandler2::AHandler2((AHandler2 *)&b);
  m.handlers_.super__Tuple_impl<0UL,_BHandler_&>.super__Head_base<0UL,_BHandler_&,_false>.
  _M_head_impl = (_Tuple_impl<0UL,_BHandler_&>)(_Head_base<0UL,_BHandler_&,_false>)0x0;
  BHandler::BHandler((BHandler *)&m.handlers_);
  holden::make_mediator<BHandler>((holden *)local_38,(BHandler *)&m.handlers_);
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  GetB::GetB((GetB *)&gtest_ar.message_);
  rVar2 = holden::mediator<BHandler_&>::send<GetB>
                    ((mediator<BHandler_&> *)local_38,(GetB *)&gtest_ar.message_);
  GetB::~GetB((GetB *)&gtest_ar.message_);
  local_64._0_4_ = 3;
  pBVar4 = (BHandler *)local_64;
  local_48[0] = rVar2;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)(local_64 + 4),"3","b_res",(int *)pBVar4,local_48);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_64 + 4));
  if (!bVar1) {
    testing::Message::Message(&local_70);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)(local_64 + 4));
    pBVar4 = (BHandler *)0x32;
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nolanholden[P]cpp-mediator/tests/mediator_unittests.cc"
               ,0x32,pcVar3);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    testing::Message::~Message(&local_70);
  }
  m_1.handlers_.super__Tuple_impl<0UL,_AHandler1_&,_BHandler_&>.
  super__Head_base<0UL,_AHandler1_&,_false>._M_head_impl._5_3_ = 0;
  m_1.handlers_.super__Tuple_impl<0UL,_AHandler1_&,_BHandler_&>.
  super__Head_base<0UL,_AHandler1_&,_false>._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_64 + 4));
  if (m_1.handlers_.super__Tuple_impl<0UL,_AHandler1_&,_BHandler_&>.
      super__Head_base<0UL,_AHandler1_&,_false>._M_head_impl._4_4_ == 0) {
    m_1.handlers_.super__Tuple_impl<0UL,_AHandler1_&,_BHandler_&>.
    super__Head_base<0UL,_AHandler1_&,_false>._M_head_impl._4_4_ = 0;
  }
  holden::mediator<BHandler_&>::~mediator((mediator<BHandler_&> *)local_38);
  if (m_1.handlers_.super__Tuple_impl<0UL,_AHandler1_&,_BHandler_&>.
      super__Head_base<0UL,_AHandler1_&,_false>._M_head_impl._4_4_ == 0) {
    holden::make_mediator<AHandler1,BHandler>
              ((mediator<AHandler1_&,_BHandler_&> *)local_98,(holden *)&a2,(AHandler1 *)&m.handlers_
               ,pBVar4);
    gtest_ar_1.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    GetA::GetA((GetA *)&gtest_ar_1.message_);
    rVar2 = holden::mediator<AHandler1_&,_BHandler_&>::send<GetA>
                      ((mediator<AHandler1_&,_BHandler_&> *)local_98,(GetA *)&gtest_ar_1.message_);
    GetA::~GetA((GetA *)&gtest_ar_1.message_);
    local_bc._0_4_ = 1;
    pBVar4 = (BHandler *)local_bc;
    local_9c = rVar2;
    testing::internal::EqHelper<false>::Compare<int,int>
              ((EqHelper<false> *)(local_bc + 4),"1","a_res",(int *)pBVar4,&local_9c);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_bc + 4));
    if (!bVar1) {
      testing::Message::Message(&local_c8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)(local_bc + 4));
      pBVar4 = (BHandler *)0x38;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffff30,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/nolanholden[P]cpp-mediator/tests/mediator_unittests.cc"
                 ,0x38,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xffffffffffffff30,&local_c8)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff30);
      testing::Message::~Message(&local_c8);
    }
    m_1.handlers_.super__Tuple_impl<0UL,_AHandler1_&,_BHandler_&>.
    super__Head_base<0UL,_AHandler1_&,_false>._M_head_impl._5_3_ = 0;
    m_1.handlers_.super__Tuple_impl<0UL,_AHandler1_&,_BHandler_&>.
    super__Head_base<0UL,_AHandler1_&,_false>._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)(local_bc + 4));
    if (m_1.handlers_.super__Tuple_impl<0UL,_AHandler1_&,_BHandler_&>.
        super__Head_base<0UL,_AHandler1_&,_false>._M_head_impl._4_4_ == 0) {
      gtest_ar_2.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      GetB::GetB((GetB *)&gtest_ar_2.message_);
      rVar2 = holden::mediator<AHandler1_&,_BHandler_&>::send<GetB>
                        ((mediator<AHandler1_&,_BHandler_&> *)local_98,(GetB *)&gtest_ar_2.message_)
      ;
      GetB::~GetB((GetB *)&gtest_ar_2.message_);
      local_f4._0_4_ = 3;
      pBVar4 = (BHandler *)local_f4;
      local_d4 = rVar2;
      testing::internal::EqHelper<false>::Compare<int,int>
                ((EqHelper<false> *)(local_f4 + 4),"3","b_res",(int *)pBVar4,&local_d4);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_f4 + 4));
      if (!bVar1) {
        testing::Message::Message(&local_100);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)(local_f4 + 4));
        pBVar4 = (BHandler *)0x3a;
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)
                   &m_2.handlers_.super__Tuple_impl<0UL,_AHandler2_&,_BHandler_&>.
                    super__Head_base<0UL,_AHandler2_&,_false>,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/nolanholden[P]cpp-mediator/tests/mediator_unittests.cc"
                   ,0x3a,pcVar3);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)
                   &m_2.handlers_.super__Tuple_impl<0UL,_AHandler2_&,_BHandler_&>.
                    super__Head_base<0UL,_AHandler2_&,_false>,&local_100);
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)
                   &m_2.handlers_.super__Tuple_impl<0UL,_AHandler2_&,_BHandler_&>.
                    super__Head_base<0UL,_AHandler2_&,_false>);
        testing::Message::~Message(&local_100);
      }
      m_1.handlers_.super__Tuple_impl<0UL,_AHandler1_&,_BHandler_&>.
      super__Head_base<0UL,_AHandler1_&,_false>._M_head_impl._5_3_ = 0;
      m_1.handlers_.super__Tuple_impl<0UL,_AHandler1_&,_BHandler_&>.
      super__Head_base<0UL,_AHandler1_&,_false>._M_head_impl._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)(local_f4 + 4));
      if (m_1.handlers_.super__Tuple_impl<0UL,_AHandler1_&,_BHandler_&>.
          super__Head_base<0UL,_AHandler1_&,_false>._M_head_impl._4_4_ == 0) {
        m_1.handlers_.super__Tuple_impl<0UL,_AHandler1_&,_BHandler_&>.
        super__Head_base<0UL,_AHandler1_&,_false>._M_head_impl._4_4_ = 0;
      }
    }
    holden::mediator<AHandler1_&,_BHandler_&>::~mediator
              ((mediator<AHandler1_&,_BHandler_&> *)local_98);
    if (m_1.handlers_.super__Tuple_impl<0UL,_AHandler1_&,_BHandler_&>.
        super__Head_base<0UL,_AHandler1_&,_false>._M_head_impl._4_4_ == 0) {
      holden::make_mediator<AHandler2,BHandler>
                ((mediator<AHandler2_&,_BHandler_&> *)local_120,(holden *)&b,
                 (AHandler2 *)&m.handlers_,pBVar4);
      gtest_ar_3.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      GetA::GetA((GetA *)&gtest_ar_3.message_);
      rVar2 = holden::mediator<AHandler2_&,_BHandler_&>::send<GetA>
                        ((mediator<AHandler2_&,_BHandler_&> *)local_120,(GetA *)&gtest_ar_3.message_
                        );
      GetA::~GetA((GetA *)&gtest_ar_3.message_);
      local_144 = 2;
      local_124 = rVar2;
      testing::internal::EqHelper<false>::Compare<int,int>
                ((EqHelper<false> *)local_140,"2","a_res",&local_144,&local_124);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
      if (!bVar1) {
        testing::Message::Message(&local_150);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_140);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xfffffffffffffea8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/nolanholden[P]cpp-mediator/tests/mediator_unittests.cc"
                   ,0x40,pcVar3);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xfffffffffffffea8,&local_150);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffea8);
        testing::Message::~Message(&local_150);
      }
      m_1.handlers_.super__Tuple_impl<0UL,_AHandler1_&,_BHandler_&>.
      super__Head_base<0UL,_AHandler1_&,_false>._M_head_impl._5_3_ = 0;
      m_1.handlers_.super__Tuple_impl<0UL,_AHandler1_&,_BHandler_&>.
      super__Head_base<0UL,_AHandler1_&,_false>._M_head_impl._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
      if (m_1.handlers_.super__Tuple_impl<0UL,_AHandler1_&,_BHandler_&>.
          super__Head_base<0UL,_AHandler1_&,_false>._M_head_impl._4_4_ == 0) {
        gtest_ar_4.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        GetB::GetB((GetB *)&gtest_ar_4.message_);
        rVar2 = holden::mediator<AHandler2_&,_BHandler_&>::send<GetB>
                          ((mediator<AHandler2_&,_BHandler_&> *)local_120,
                           (GetB *)&gtest_ar_4.message_);
        GetB::~GetB((GetB *)&gtest_ar_4.message_);
        local_17c = 3;
        local_15c = rVar2;
        testing::internal::EqHelper<false>::Compare<int,int>
                  ((EqHelper<false> *)local_178,"3","b_res",&local_17c,&local_15c);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_178);
        if (!bVar1) {
          testing::Message::Message(&local_188);
          pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_178);
          testing::internal::AssertHelper::AssertHelper
                    (&local_190,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/nolanholden[P]cpp-mediator/tests/mediator_unittests.cc"
                     ,0x42,pcVar3);
          testing::internal::AssertHelper::operator=(&local_190,&local_188);
          testing::internal::AssertHelper::~AssertHelper(&local_190);
          testing::Message::~Message(&local_188);
        }
        m_1.handlers_.super__Tuple_impl<0UL,_AHandler1_&,_BHandler_&>.
        super__Head_base<0UL,_AHandler1_&,_false>._M_head_impl._5_3_ = 0;
        m_1.handlers_.super__Tuple_impl<0UL,_AHandler1_&,_BHandler_&>.
        super__Head_base<0UL,_AHandler1_&,_false>._M_head_impl._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_178);
        if (m_1.handlers_.super__Tuple_impl<0UL,_AHandler1_&,_BHandler_&>.
            super__Head_base<0UL,_AHandler1_&,_false>._M_head_impl._4_4_ == 0) {
          m_1.handlers_.super__Tuple_impl<0UL,_AHandler1_&,_BHandler_&>.
          super__Head_base<0UL,_AHandler1_&,_false>._M_head_impl._4_4_ = 0;
        }
      }
      holden::mediator<AHandler2_&,_BHandler_&>::~mediator
                ((mediator<AHandler2_&,_BHandler_&> *)local_120);
      if (m_1.handlers_.super__Tuple_impl<0UL,_AHandler1_&,_BHandler_&>.
          super__Head_base<0UL,_AHandler1_&,_false>._M_head_impl._4_4_ == 0) {
        m_1.handlers_.super__Tuple_impl<0UL,_AHandler1_&,_BHandler_&>.
        super__Head_base<0UL,_AHandler1_&,_false>._M_head_impl._4_4_ = 0;
      }
    }
  }
  BHandler::~BHandler((BHandler *)&m.handlers_);
  AHandler2::~AHandler2((AHandler2 *)&b);
  AHandler1::~AHandler1((AHandler1 *)&a2);
  return;
}

Assistant:

TEST(cpp_mediator, send_receive) {
  AHandler1 a1{};
  AHandler2 a2{};
  BHandler b{};

  // None of these should compile!:
  // 
  // auto m = holden::make_mediator(); // error: no handler for `GetA` exists
  // m.send(GetA{});
  // 
  // auto m = holden::make_mediator(b); // error: no handler for `GetA` exists
  // m.send(GetA{});
  // 
  // auto m = holden::make_mediator(a1, a2, b); // error: more than one handler 
  // m.send(GetA{});                            //  for a given request
  // 
  // auto m = holden::make_mediator(a1, a1, b); // error: more than one handler 
  // m.send(GetA{});                            //  for a given request
  // 

  {
    auto m = holden::make_mediator(b);
    auto b_res = m.send(GetB{});
    ASSERT_EQ(3, b_res);
  }

  {
    auto m = holden::make_mediator(a1, b);
    auto a_res =  m.send(GetA{});
    ASSERT_EQ(1, a_res);
    auto b_res = m.send(GetB{});
    ASSERT_EQ(3, b_res);
  }

  {
    auto m = holden::make_mediator(a2, b);
    auto a_res =  m.send(GetA{});
    ASSERT_EQ(2, a_res);
    auto b_res = m.send(GetB{});
    ASSERT_EQ(3, b_res);
  }
}